

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O1

mz_bool mz_zip_writer_add_file
                  (mz_zip_archive *pZip,char *pArchive_name,char *pSrc_filename,void *pComment,
                  mz_uint16 comment_size,mz_uint level_and_flags)

{
  char cVar1;
  mz_uint mVar2;
  bool bVar3;
  mz_uint16 method;
  mz_uint16 mVar4;
  size_t sVar5;
  undefined1 uVar6;
  mz_bool mVar7;
  tdefl_status tVar8;
  char *pcVar9;
  FILE *__stream;
  void *pvVar10;
  size_t sVar11;
  mz_uint8 *ptr;
  ulong uVar12;
  void *pvVar13;
  long lVar14;
  mz_uint64 mVar15;
  void *pvVar16;
  ushort uVar17;
  uint uVar18;
  mz_uint16 dos_date_00;
  mz_uint64 in_stack_ffffffffffffff28;
  mz_ulong uncomp_size;
  mz_uint16 dos_date;
  mz_uint16 dos_time;
  ulong local_b8;
  void *local_b0;
  int local_a4;
  size_t local_a0;
  tdefl_compressor *local_98;
  mz_uint64 local_90;
  undefined8 local_88;
  undefined1 uStack_80;
  undefined1 uStack_7f;
  undefined1 uStack_7e;
  undefined1 uStack_7d;
  undefined1 uStack_7c;
  undefined1 uStack_7b;
  undefined1 uStack_7a;
  undefined1 uStack_79;
  undefined1 uStack_78;
  undefined1 uStack_77;
  undefined1 uStack_76;
  undefined1 uStack_75;
  undefined1 uStack_74;
  undefined1 uStack_73;
  ulong uStack_72;
  ulong local_60;
  void *local_58;
  void *local_50;
  mz_zip_writer_add_state state;
  
  dos_time = 0;
  dos_date = 0;
  uVar18 = 6;
  if (-1 < (int)level_and_flags) {
    uVar18 = level_and_flags;
  }
  if (((pZip->m_pState != (mz_zip_internal_state *)0x0) && (pArchive_name != (char *)0x0)) &&
     (pZip->m_zip_mode == MZ_ZIP_MODE_WRITING)) {
    if ((((uVar18 >> 10 & 1) == 0) && (pComment != (void *)0x0 || comment_size == 0)) &&
       (((uVar18 & 0xf) < 0xb && (*pArchive_name != '/')))) {
      mVar15 = pZip->m_archive_size;
      for (pcVar9 = pArchive_name; cVar1 = *pcVar9, cVar1 != '\0'; pcVar9 = pcVar9 + 1) {
        if (cVar1 == ':') {
          return 0;
        }
        if (cVar1 == '\\') {
          return 0;
        }
      }
      local_58 = pComment;
      local_a0 = strlen(pArchive_name);
      if ((local_a0 < 0x10000) && (pZip->m_total_files != 0xffff)) {
        mVar2 = pZip->m_file_offset_alignment;
        local_b8 = (ulong)(mVar2 - ((uint)mVar15 & mVar2 - 1) & mVar2 - 1);
        if (mVar2 == 0) {
          local_b8 = 0;
        }
        local_90 = mVar15 + local_b8;
        local_60 = (ulong)comment_size;
        if (((local_a0 + local_60 + local_90 + 0x4c >> 0x20 == 0) &&
            (mVar7 = mz_zip_get_file_modified_time(pSrc_filename,&dos_time,&dos_date), mVar7 != 0))
           && (__stream = fopen(pSrc_filename,"rb"), __stream != (FILE *)0x0)) {
          fseeko(__stream,0,2);
          pvVar10 = (void *)ftello(__stream);
          fseeko(__stream,0,0);
          if ((ulong)pvVar10 >> 0x20 == 0) {
            uVar18 = uVar18 & 0xf;
            if (pvVar10 < (void *)0x4) {
              uVar18 = 0;
            }
            lVar14 = local_b8 + 0x1e;
            local_b0 = pvVar10;
            mVar7 = mz_zip_writer_write_zeros(pZip,mVar15,(mz_uint32)lVar14);
            sVar5 = local_a0;
            if (mVar7 == 0) {
              return 0;
            }
            mVar15 = lVar14 + mVar15;
            uStack_78 = 0;
            uStack_77 = 0;
            uStack_76 = 0;
            uStack_75 = 0;
            uStack_74 = 0;
            uStack_73 = 0;
            uStack_72 = 0;
            local_88 = 0;
            uStack_80 = 0;
            uStack_7f = 0;
            uStack_7e = 0;
            uStack_7d = 0;
            uStack_7c = 0;
            uStack_7b = 0;
            uStack_7a = 0;
            uStack_79 = 0;
            sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,mVar15,pArchive_name,local_a0);
            if (sVar11 == sVar5) {
              local_b8 = mVar15 + sVar5;
              pvVar10 = (void *)0x0;
              if (local_b0 == (void *)0x0) {
                uVar17 = 0;
                uncomp_size = 0;
              }
              else {
                ptr = (mz_uint8 *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x10000);
                if (ptr == (mz_uint8 *)0x0) {
                  fclose(__stream);
                  pvVar10 = (void *)0x0;
                  bVar3 = false;
                  uVar17 = 0;
                  uncomp_size = 0;
                }
                else if (uVar18 == 0) {
                  uncomp_size = 0;
                  pvVar10 = local_b0;
                  do {
                    if (pvVar10 == (void *)0x0) {
                      uVar17 = 0;
                      pvVar10 = local_b0;
                      goto LAB_00136f37;
                    }
                    pvVar16 = (void *)0x10000;
                    if (pvVar10 < (void *)0x10000) {
                      pvVar16 = pvVar10;
                    }
                    pvVar13 = (void *)fread(ptr,1,(size_t)pvVar16,__stream);
                    if ((pvVar13 == pvVar16) &&
                       (pvVar13 = (void *)(*pZip->m_pWrite)(pZip->m_pIO_opaque,local_b8,ptr,
                                                            (size_t)pvVar16), pvVar13 == pvVar16)) {
                      uncomp_size = mz_crc32(uncomp_size & 0xffffffff,ptr,(size_t)pvVar16);
                      pvVar10 = (void *)((long)pvVar10 - (long)pvVar16);
                      local_b8 = local_b8 + (long)pvVar16;
                      bVar3 = true;
                    }
                    else {
                      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
                      fclose(__stream);
                      bVar3 = false;
                    }
                  } while (bVar3);
                  pvVar10 = (void *)0x0;
                  bVar3 = false;
                  uVar17 = 0;
                }
                else {
                  local_98 = (tdefl_compressor *)(*pZip->m_pAlloc)(pZip->m_pAlloc_opaque,1,0x4df78);
                  if (local_98 == (tdefl_compressor *)0x0) {
                    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
                    fclose(__stream);
                    pvVar10 = (void *)0x0;
                    bVar3 = false;
                    uVar17 = 0;
                    uncomp_size = 0;
                  }
                  else {
                    state.m_cur_archive_file_ofs = local_b8;
                    uVar12 = 10;
                    if (uVar18 < 10) {
                      uVar12 = (ulong)uVar18;
                    }
                    state.m_comp_size = 0;
                    state.m_pZip = pZip;
                    tdefl_init(local_98,mz_zip_writer_add_put_buf_callback,&state,
                               (uint)(uVar18 < 4) << 0xe | s_tdefl_num_probes[uVar12]);
                    local_a4 = 0;
                    uncomp_size = 0;
                    pvVar10 = local_b0;
                    do {
                      pvVar16 = (void *)0x10000;
                      if (pvVar10 < (void *)0x10000) {
                        pvVar16 = pvVar10;
                      }
                      pvVar13 = (void *)fread(ptr,1,(size_t)pvVar16,__stream);
                      if (pvVar13 == pvVar16) {
                        uncomp_size = mz_crc32(uncomp_size & 0xffffffff,ptr,(size_t)pvVar16);
                        pvVar10 = (void *)((long)pvVar10 - (long)pvVar16);
                        bVar3 = false;
                        local_50 = pvVar16;
                        tVar8 = tdefl_compress(local_98,ptr,(size_t *)&local_50,(void *)0x0,
                                               (size_t *)0x0,(uint)(pvVar10 == (void *)0x0) << 2);
                        if (tVar8 == TDEFL_STATUS_OKAY) {
                          bVar3 = true;
                        }
                        else {
                          if (tVar8 != TDEFL_STATUS_DONE) goto LAB_00136db3;
                          local_a4 = 1;
                        }
                      }
                      else {
LAB_00136db3:
                        bVar3 = false;
                      }
                    } while (bVar3);
                    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_98);
                    if (local_a4 == 0) {
                      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
                      fclose(__stream);
                      pvVar10 = (void *)0x0;
                      bVar3 = false;
                      uVar17 = 0;
                    }
                    else {
                      local_b8 = state.m_cur_archive_file_ofs;
                      uVar17 = 8;
                      bVar3 = true;
                      pvVar10 = (void *)state.m_comp_size;
                    }
                  }
                  if (bVar3) {
LAB_00136f37:
                    (*pZip->m_pFree)(pZip->m_pAlloc_opaque,ptr);
                    bVar3 = true;
                  }
                  else {
                    bVar3 = false;
                  }
                }
                if (!bVar3) {
                  return 0;
                }
              }
              fclose(__stream);
              mVar4 = dos_time;
              method = dos_date;
              if ((ulong)pvVar10 >> 0x20 != 0) {
                return 0;
              }
              if (local_b8 >> 0x20 != 0) {
                return 0;
              }
              uVar6 = 0x14;
              if (uVar17 == 0) {
                uVar6 = 0;
              }
              local_88 = (ulong)CONCAT14(uVar6,0x4034b50);
              uStack_80 = (undefined1)uVar17;
              uStack_7f = 0;
              uStack_7e = (undefined1)dos_time;
              uStack_7d = (undefined1)(dos_time >> 8);
              uStack_7c = (undefined1)dos_date;
              uStack_7b = (undefined1)(dos_date >> 8);
              uStack_7a = (undefined1)uncomp_size;
              uStack_79 = (undefined1)(uncomp_size >> 8);
              uStack_78 = (undefined1)(uncomp_size >> 0x10);
              uStack_77 = (undefined1)(uncomp_size >> 0x18);
              uStack_76 = SUB81(pvVar10,0);
              uStack_75 = (undefined1)((ulong)pvVar10 >> 8);
              uStack_74 = (undefined1)((ulong)pvVar10 >> 0x10);
              uStack_73 = (undefined1)((ulong)pvVar10 >> 0x18);
              uStack_72 = (ulong)CONCAT15((char)(local_a0 >> 8),
                                          CONCAT14((char)local_a0,(int)local_b0));
              dos_date_00 = 0x704c;
              sVar11 = (*pZip->m_pWrite)(pZip->m_pIO_opaque,local_90,&local_88,0x1e);
              if (sVar11 != 0x1e) {
                return 0;
              }
              mVar7 = mz_zip_writer_add_to_central_dir
                                (pZip,pArchive_name,(mz_uint16)local_a0,local_58,(mz_uint16)local_60
                                 ,local_b0,(mz_uint16)pvVar10,uncomp_size,(ulong)uVar17,(uint)mVar4,
                                 method,(mz_uint16)local_90,0,dos_date_00,in_stack_ffffffffffffff28,
                                 (mz_uint32)uncomp_size);
              if (mVar7 == 0) {
                return 0;
              }
              pZip->m_total_files = pZip->m_total_files + 1;
              pZip->m_archive_size = local_b8;
              return 1;
            }
          }
          fclose(__stream);
        }
      }
    }
  }
  return 0;
}

Assistant:

mz_bool mz_zip_writer_add_file(mz_zip_archive* pZip, const char* pArchive_name, const char* pSrc_filename, const void* pComment, mz_uint16 comment_size, mz_uint level_and_flags) {
  mz_uint uncomp_crc32 = MZ_CRC32_INIT, level, num_alignment_padding_bytes;
  mz_uint16 method = 0, dos_time = 0, dos_date = 0, ext_attributes = 0;
  mz_uint64 local_dir_header_ofs = pZip->m_archive_size, cur_archive_file_ofs = pZip->m_archive_size, uncomp_size = 0, comp_size = 0;
  size_t archive_name_size;
  mz_uint8 local_dir_header[MZ_ZIP_LOCAL_DIR_HEADER_SIZE];
  MZ_FILE* pSrc_file = NULL;

  if ((int)level_and_flags < 0)
    level_and_flags = MZ_DEFAULT_LEVEL;
  level = level_and_flags & 0xF;

  if ((!pZip) || (!pZip->m_pState) || (pZip->m_zip_mode != MZ_ZIP_MODE_WRITING) || (!pArchive_name) || ((comment_size) && (!pComment)) || (level > MZ_UBER_COMPRESSION))
    return MZ_FALSE;
  if (level_and_flags & MZ_ZIP_FLAG_COMPRESSED_DATA)
    return MZ_FALSE;
  if (!mz_zip_writer_validate_archive_name(pArchive_name))
    return MZ_FALSE;

  archive_name_size = strlen(pArchive_name);
  if (archive_name_size > 0xFFFF)
    return MZ_FALSE;

  num_alignment_padding_bytes = mz_zip_writer_compute_padding_needed_for_file_alignment(pZip);

  // no zip64 support yet
  if ((pZip->m_total_files == 0xFFFF) || ((pZip->m_archive_size + num_alignment_padding_bytes + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + MZ_ZIP_CENTRAL_DIR_HEADER_SIZE + comment_size + archive_name_size) > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_get_file_modified_time(pSrc_filename, &dos_time, &dos_date))
    return MZ_FALSE;

  pSrc_file = MZ_FOPEN(pSrc_filename, "rb");
  if (!pSrc_file)
    return MZ_FALSE;
  MZ_FSEEK64(pSrc_file, 0, SEEK_END);
  uncomp_size = MZ_FTELL64(pSrc_file);
  MZ_FSEEK64(pSrc_file, 0, SEEK_SET);

  if (uncomp_size > 0xFFFFFFFF) {
    // No zip64 support yet
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  if (uncomp_size <= 3)
    level = 0;

  if (!mz_zip_writer_write_zeros(pZip, cur_archive_file_ofs, num_alignment_padding_bytes + sizeof(local_dir_header)))
    return MZ_FALSE;
  local_dir_header_ofs += num_alignment_padding_bytes;
  if (pZip->m_file_offset_alignment) {
    MZ_ASSERT((local_dir_header_ofs & (pZip->m_file_offset_alignment - 1)) == 0);
  }
  cur_archive_file_ofs += num_alignment_padding_bytes + sizeof(local_dir_header);

  MZ_CLEAR_OBJ(local_dir_header);
  if (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pArchive_name, archive_name_size) != archive_name_size) {
    MZ_FCLOSE(pSrc_file);
    return MZ_FALSE;
  }
  cur_archive_file_ofs += archive_name_size;

  if (uncomp_size) {
    mz_uint64 uncomp_remaining = uncomp_size;
    void* pRead_buf = pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, MZ_ZIP_MAX_IO_BUF_SIZE);
    if (!pRead_buf) {
      MZ_FCLOSE(pSrc_file);
      return MZ_FALSE;
    }

    if (!level) {
      while (uncomp_remaining) {
        mz_uint n = (mz_uint)MZ_MIN(MZ_ZIP_MAX_IO_BUF_SIZE, uncomp_remaining);
        if ((MZ_FREAD(pRead_buf, 1, n, pSrc_file) != n) || (pZip->m_pWrite(pZip->m_pIO_opaque, cur_archive_file_ofs, pRead_buf, n) != n)) {
          pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
          MZ_FCLOSE(pSrc_file);
          return MZ_FALSE;
        }
        uncomp_crc32 = (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8*)pRead_buf, n);
        uncomp_remaining -= n;
        cur_archive_file_ofs += n;
      }
      comp_size = uncomp_size;
    } else {
      mz_bool result = MZ_FALSE;
      mz_zip_writer_add_state state;
      tdefl_compressor* pComp = (tdefl_compressor*)pZip->m_pAlloc(pZip->m_pAlloc_opaque, 1, sizeof(tdefl_compressor));
      if (!pComp) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      state.m_pZip = pZip;
      state.m_cur_archive_file_ofs = cur_archive_file_ofs;
      state.m_comp_size = 0;

      if (tdefl_init(pComp, mz_zip_writer_add_put_buf_callback, &state, tdefl_create_comp_flags_from_zip_params(level, -15, MZ_DEFAULT_STRATEGY)) != TDEFL_STATUS_OKAY) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      for (;;) {
        size_t in_buf_size = (mz_uint32)MZ_MIN(uncomp_remaining, MZ_ZIP_MAX_IO_BUF_SIZE);
        tdefl_status status;

        if (MZ_FREAD(pRead_buf, 1, in_buf_size, pSrc_file) != in_buf_size)
          break;

        uncomp_crc32 = (mz_uint32)mz_crc32(uncomp_crc32, (const mz_uint8*)pRead_buf, in_buf_size);
        uncomp_remaining -= in_buf_size;

        status = tdefl_compress_buffer(pComp, pRead_buf, in_buf_size, uncomp_remaining ? TDEFL_NO_FLUSH : TDEFL_FINISH);
        if (status == TDEFL_STATUS_DONE) {
          result = MZ_TRUE;
          break;
        } else if (status != TDEFL_STATUS_OKAY)
          break;
      }

      pZip->m_pFree(pZip->m_pAlloc_opaque, pComp);

      if (!result) {
        pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
        MZ_FCLOSE(pSrc_file);
        return MZ_FALSE;
      }

      comp_size = state.m_comp_size;
      cur_archive_file_ofs = state.m_cur_archive_file_ofs;

      method = MZ_DEFLATED;
    }

    pZip->m_pFree(pZip->m_pAlloc_opaque, pRead_buf);
  }

  MZ_FCLOSE(pSrc_file);
  pSrc_file = NULL;

  // no zip64 support yet
  if ((comp_size > 0xFFFFFFFF) || (cur_archive_file_ofs > 0xFFFFFFFF))
    return MZ_FALSE;

  if (!mz_zip_writer_create_local_dir_header(pZip, local_dir_header, (mz_uint16)archive_name_size, 0, uncomp_size, comp_size, uncomp_crc32, method, 0, dos_time, dos_date))
    return MZ_FALSE;

  if (pZip->m_pWrite(pZip->m_pIO_opaque, local_dir_header_ofs, local_dir_header, sizeof(local_dir_header)) != sizeof(local_dir_header))
    return MZ_FALSE;

  if (!mz_zip_writer_add_to_central_dir(pZip, pArchive_name, (mz_uint16)archive_name_size, NULL, 0, pComment, comment_size, uncomp_size, comp_size, uncomp_crc32, method, 0, dos_time, dos_date, local_dir_header_ofs, ext_attributes))
    return MZ_FALSE;

  pZip->m_total_files++;
  pZip->m_archive_size = cur_archive_file_ofs;

  return MZ_TRUE;
}